

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscreteParameters.cpp
# Opt level: O0

void __thiscall PlanningUnitMADPDiscreteParameters::Print(PlanningUnitMADPDiscreteParameters *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  PlanningUnitMADPDiscreteParameters *in_RDI;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeIndividualObservationHistories: ");
  bVar1 = GetComputeIndividualObservationHistories(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeIndividualActionHistories: ");
  bVar1 = GetComputeIndividualActionHistories(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeIndividualActionObservationHistories: ");
  bVar1 = GetComputeIndividualActionObservationHistories(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeJointObservationHistories: ");
  bVar1 = GetComputeJointObservationHistories(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeJointActionHistories: ");
  bVar1 = GetComputeJointActionHistories(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeJointActionObservationHistories: ");
  bVar1 = GetComputeJointActionObservationHistories(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"ComputeJointBeliefs: ");
  bVar1 = GetComputeJointBeliefs(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"UseSparseJointBeliefs: ");
  bVar1 = GetUseSparseJointBeliefs(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PlanningUnitMADPDiscreteParameters::Print() const
{
    cout << "ComputeIndividualObservationHistories: "
         << GetComputeIndividualObservationHistories() << endl;

    cout << "ComputeIndividualActionHistories: "
         << GetComputeIndividualActionHistories() << endl;

    cout << "ComputeIndividualActionObservationHistories: "
         << GetComputeIndividualActionObservationHistories() << endl;

    cout << "ComputeJointObservationHistories: "
         << GetComputeJointObservationHistories() << endl;

    cout << "ComputeJointActionHistories: "
         << GetComputeJointActionHistories() << endl;

    cout << "ComputeJointActionObservationHistories: "
         << GetComputeJointActionObservationHistories() << endl;

    cout << "ComputeJointBeliefs: "
         << GetComputeJointBeliefs() << endl;

    cout << "UseSparseJointBeliefs: "
         << GetUseSparseJointBeliefs() << endl;
}